

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O1

void trt_pose::parse::assignment_out
               (int *connections,float *score_graph,int count_a,int count_b,int M,
               float score_threshold,void *workspace)

{
  ulong uVar1;
  void *pvVar2;
  float *pfVar3;
  ulong uVar4;
  long lVar5;
  PairGraph star_graph;
  PairGraph local_68;
  
  lVar5 = (long)M;
  if (0 < count_a) {
    uVar1 = 0;
    pvVar2 = workspace;
    pfVar3 = score_graph;
    do {
      if (0 < count_b) {
        uVar4 = 0;
        do {
          *(float *)((long)pvVar2 + uVar4 * 4) = -pfVar3[uVar4];
          uVar4 = uVar4 + 1;
        } while ((uint)count_b != uVar4);
      }
      uVar1 = uVar1 + 1;
      pfVar3 = pfVar3 + lVar5;
      pvVar2 = (void *)((long)pvVar2 + lVar5 * 4);
    } while (uVar1 != (uint)count_a);
  }
  utils::PairGraph::PairGraph(&local_68,count_a,count_b);
  _munkres((float *)workspace,M,&local_68,count_a,count_b);
  if (0 < count_a) {
    uVar1 = 0;
    do {
      if (0 < count_b) {
        uVar4 = 0;
        do {
          if ((uVar4 == (uint)local_68.rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar1]) &&
             (score_threshold < score_graph[uVar4])) {
            connections[uVar1] = (int)uVar4;
            connections[lVar5 + uVar4] = (int)uVar1;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)count_b != uVar4);
      }
      uVar1 = uVar1 + 1;
      score_graph = score_graph + lVar5;
    } while (uVar1 != (uint)count_a);
  }
  if (local_68.cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.rows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void assignment_out(int *connections,         // 2xM
                    const float *score_graph, // MxM
                    const int count_a, const int count_b, const int M,
                    const float score_threshold, void *workspace) {
  const int nrows = count_a;
  const int ncols = count_b;

  // compute cost graph (negate score graph)
  float *cost_graph = (float *)workspace;
  for (int i = 0; i < count_a; i++) {
    for (int j = 0; j < count_b; j++) {
      const int idx = i * M + j;
      cost_graph[idx] = -score_graph[idx];
    }
  }

  // run munkres algorithm
  auto star_graph = PairGraph(nrows, ncols);
  _munkres(cost_graph, M, star_graph, nrows, ncols);

  // fill output connections
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (star_graph.isPair(i, j) && score_graph[i * M + j] > score_threshold) {
        connections[0 * M + i] = j;
        connections[1 * M + j] = i;
      }
    }
  }
}